

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O3

void __thiscall pugi::xml_writer_stream::~xml_writer_stream(xml_writer_stream *this)

{
  operator_delete(this,0x18);
  return;
}

Assistant:

class PUGIXML_CLASS xml_writer_stream: public xml_writer
	{
	public:
		// Construct writer from an output stream object
		xml_writer_stream(std::basic_ostream<char, std::char_traits<char> >& stream);
		xml_writer_stream(std::basic_ostream<wchar_t, std::char_traits<wchar_t> >& stream);

		virtual void write(const void* data, size_t size) PUGIXML_OVERRIDE;

	private:
		std::basic_ostream<char, std::char_traits<char> >* narrow_stream;
		std::basic_ostream<wchar_t, std::char_traits<wchar_t> >* wide_stream;
	}